

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

TrieNode<unsigned_short> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,size_t depth)

{
  pointer ppuVar1;
  uchar *puVar2;
  iterator iVar3;
  TrieNode<unsigned_short> *__s;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar4;
  long lVar5;
  ushort uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uchar **__args;
  uint j;
  ulong uVar10;
  long lVar11;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  ushort auStack_2b0 [64];
  uchar *local_230 [64];
  
  __s = (TrieNode<unsigned_short> *)operator_new(0x82000);
  uVar10 = 0;
  memset(__s,0,0x82000);
  uVar8 = (uint)((ulong)((long)(bucket->
                               super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(bucket->
                              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0x3f < uVar8) {
    lVar11 = 0;
    uVar10 = 0;
    do {
      ppuVar1 = (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      lVar5 = 0;
      do {
        puVar2 = *(uchar **)((long)ppuVar1 + lVar5 * 8 + lVar11);
        local_230[lVar5] = puVar2;
        if (puVar2 == (uchar *)0x0) goto LAB_0019eb67;
        if (puVar2[depth] == '\0') {
          uVar6 = 0;
        }
        else {
          uVar6 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        auStack_2b0[lVar5] = uVar6;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      __args = local_230;
      lVar5 = 0;
      do {
        uVar6 = auStack_2b0[lVar5];
        pvVar4 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                 (__s->buckets)._M_elems[uVar6];
        if (pvVar4 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
          pvVar4 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
          *(undefined8 *)pvVar4 = 0;
          *(undefined8 *)(pvVar4 + 8) = 0;
          *(undefined8 *)(pvVar4 + 0x10) = 0;
          (__s->buckets)._M_elems[uVar6] = pvVar4;
        }
        iVar3._M_current = *(uchar ***)(pvVar4 + 8);
        if (iVar3._M_current == *(uchar ***)(pvVar4 + 0x10)) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>(pvVar4,iVar3,__args);
        }
        else {
          *iVar3._M_current = *__args;
          *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 8;
        }
        lVar5 = lVar5 + 1;
        __args = __args + 1;
      } while (lVar5 != 0x40);
      uVar10 = uVar10 + 0x40;
      lVar11 = lVar11 + 0x200;
    } while (uVar10 < (uVar8 & 0xffffffc0));
  }
  iVar9 = uVar8 - (uint)uVar10;
  if ((uint)uVar10 <= uVar8 && iVar9 != 0) {
    uVar10 = uVar10 & 0xffffffff;
    do {
      puVar2 = (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar10];
      local_230[0] = puVar2;
      if (puVar2 == (uchar *)0x0) {
LAB_0019eb67:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == '\0') {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)CONCAT11(puVar2[depth],puVar2[depth + 1]);
      }
      pvVar4 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
               (__s->buckets)._M_elems[uVar7];
      if (pvVar4 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        pvVar4 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
        *(undefined8 *)pvVar4 = 0;
        *(undefined8 *)(pvVar4 + 8) = 0;
        *(undefined8 *)(pvVar4 + 0x10) = 0;
        (__s->buckets)._M_elems[uVar7] = pvVar4;
      }
      iVar3._M_current = *(uchar ***)(pvVar4 + 8);
      if (iVar3._M_current == *(uchar ***)(pvVar4 + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(pvVar4,iVar3,local_230);
      }
      else {
        *iVar3._M_current = puVar2;
        *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 8;
      }
      uVar10 = uVar10 + 1;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  return __s;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}